

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Souperify.cpp
# Opt level: O2

void __thiscall wasm::DataFlow::Printer::printExpression(Printer *this,Node *node)

{
  Expression *pEVar1;
  ulong uVar2;
  Node *pNVar3;
  Index i;
  Literal local_40;
  
  if (node->type != Expr) {
    __assert_fail("node->isExpr()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Souperify.cpp"
                  ,0x219,"void wasm::DataFlow::Printer::printExpression(Node *)");
  }
  pEVar1 = (node->field_1).expr;
  switch(pEVar1->_id) {
  case ConstId:
    Literal::Literal(&local_40,(Literal *)(pEVar1 + 1));
    print(this,&local_40);
    Literal::~Literal(&local_40);
    return;
  case UnaryId:
    if (5 < (ulong)*(uint *)(pEVar1 + 1)) {
      handle_unreachable("invalid op",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Souperify.cpp"
                         ,0x22d);
    }
    std::operator<<((ostream *)&std::cout,
                    &DAT_00e3e6d8 + *(int *)(&DAT_00e3e6d8 + (ulong)*(uint *)(pEVar1 + 1) * 4));
    std::operator<<((ostream *)&std::cout,' ');
    i = 0;
    break;
  case BinaryId:
    uVar2 = (ulong)*(uint *)(pEVar1 + 1);
    if ((0x2d < uVar2) || ((0x3ffffe1fffffU >> (uVar2 & 0x3f) & 1) == 0)) {
      handle_unreachable("invalid op",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Souperify.cpp"
                         ,0x289);
    }
    std::operator<<((ostream *)&std::cout,&DAT_00e3e6f0 + *(int *)(&DAT_00e3e6f0 + uVar2 * 4));
    std::operator<<((ostream *)&std::cout,' ');
    pNVar3 = Node::getValue(node,0);
    printInternal(this,pNVar3);
    std::operator<<((ostream *)&std::cout,", ");
    i = 1;
    break;
  case SelectId:
    std::operator<<((ostream *)&std::cout,"select ");
    pNVar3 = Node::getValue(node,0);
    printInternal(this,pNVar3);
    std::operator<<((ostream *)&std::cout,", ");
    pNVar3 = Node::getValue(node,1);
    printInternal(this,pNVar3);
    std::operator<<((ostream *)&std::cout,", ");
    i = 2;
    break;
  default:
    handle_unreachable("unexecpted node type",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Souperify.cpp"
                       ,0x299);
  }
  pNVar3 = Node::getValue(node,i);
  printInternal(this,pNVar3);
  return;
}

Assistant:

void printExpression(Node* node) {
    assert(node->isExpr());
    // TODO use a Visitor here?
    auto* curr = node->expr;
    if (auto* c = curr->dynCast<Const>()) {
      print(c->value);
    } else if (auto* unary = curr->dynCast<Unary>()) {
      switch (unary->op) {
        case ClzInt32:
        case ClzInt64:
          std::cout << "ctlz";
          break;
        case CtzInt32:
        case CtzInt64:
          std::cout << "cttz";
          break;
        case PopcntInt32:
        case PopcntInt64:
          std::cout << "ctpop";
          break;
        default:
          WASM_UNREACHABLE("invalid op");
      }
      std::cout << ' ';
      auto* value = node->getValue(0);
      printInternal(value);
    } else if (auto* binary = curr->dynCast<Binary>()) {
      switch (binary->op) {
        case AddInt32:
        case AddInt64:
          std::cout << "add";
          break;
        case SubInt32:
        case SubInt64:
          std::cout << "sub";
          break;
        case MulInt32:
        case MulInt64:
          std::cout << "mul";
          break;
        case DivSInt32:
        case DivSInt64:
          std::cout << "sdiv";
          break;
        case DivUInt32:
        case DivUInt64:
          std::cout << "udiv";
          break;
        case RemSInt32:
        case RemSInt64:
          std::cout << "srem";
          break;
        case RemUInt32:
        case RemUInt64:
          std::cout << "urem";
          break;
        case AndInt32:
        case AndInt64:
          std::cout << "and";
          break;
        case OrInt32:
        case OrInt64:
          std::cout << "or";
          break;
        case XorInt32:
        case XorInt64:
          std::cout << "xor";
          break;
        case ShlInt32:
        case ShlInt64:
          std::cout << "shl";
          break;
        case ShrUInt32:
        case ShrUInt64:
          std::cout << "lshr";
          break;
        case ShrSInt32:
        case ShrSInt64:
          std::cout << "ashr";
          break;
        case RotLInt32:
        case RotLInt64:
          std::cout << "rotl";
          break;
        case RotRInt32:
        case RotRInt64:
          std::cout << "rotr";
          break;
        case EqInt32:
        case EqInt64:
          std::cout << "eq";
          break;
        case NeInt32:
        case NeInt64:
          std::cout << "ne";
          break;
        case LtSInt32:
        case LtSInt64:
          std::cout << "slt";
          break;
        case LtUInt32:
        case LtUInt64:
          std::cout << "ult";
          break;
        case LeSInt32:
        case LeSInt64:
          std::cout << "sle";
          break;
        case LeUInt32:
        case LeUInt64:
          std::cout << "ule";
          break;
        default:
          WASM_UNREACHABLE("invalid op");
      }
      std::cout << ' ';
      auto* left = node->getValue(0);
      printInternal(left);
      std::cout << ", ";
      auto* right = node->getValue(1);
      printInternal(right);
    } else if (curr->is<Select>()) {
      std::cout << "select ";
      printInternal(node->getValue(0));
      std::cout << ", ";
      printInternal(node->getValue(1));
      std::cout << ", ";
      printInternal(node->getValue(2));
    } else {
      WASM_UNREACHABLE("unexecpted node type");
    }
  }